

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateInstruction(MCInst *mcInst,InternalInstruction *insn)

{
  _Bool _Var1;
  uint uVar2;
  int local_24;
  int index;
  InternalInstruction *insn_local;
  MCInst *mcInst_local;
  
  if (insn->spec == (InstructionSpecifier *)0x0) {
    mcInst_local._7_1_ = true;
  }
  else {
    MCInst_setOpcode(mcInst,(uint)insn->instructionID);
    if ((insn->xAcquireRelease & 1U) != 0) {
      uVar2 = MCInst_getOpcode(mcInst);
      if (uVar2 == 0x943) {
        MCInst_setOpcode(mcInst,0x186f);
      }
      else {
        uVar2 = MCInst_getOpcode(mcInst);
        if (uVar2 == 0x93b) {
          MCInst_setOpcode(mcInst,0x1828);
        }
      }
    }
    insn->numImmediatesTranslated = '\0';
    for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
      if ((insn->operands[local_24].encoding != '\0') &&
         (_Var1 = translateOperand(mcInst,insn->operands + local_24,insn), _Var1)) {
        return true;
      }
    }
    mcInst_local._7_1_ = false;
  }
  return mcInst_local._7_1_;
}

Assistant:

static bool translateInstruction(MCInst *mcInst, InternalInstruction *insn)
{
	int index;

	if (!insn->spec) {
		//debug("Instruction has no specification");
		return true;
	}

	MCInst_setOpcode(mcInst, insn->instructionID);

	// If when reading the prefix bytes we determined the overlapping 0xf2 or 0xf3
	// prefix bytes should be disassembled as xrelease and xacquire then set the
	// opcode to those instead of the rep and repne opcodes.
#ifndef CAPSTONE_X86_REDUCE
	if (insn->xAcquireRelease) {
		if (MCInst_getOpcode(mcInst) == X86_REP_PREFIX)
			MCInst_setOpcode(mcInst, X86_XRELEASE_PREFIX);
		else if (MCInst_getOpcode(mcInst) == X86_REPNE_PREFIX)
			MCInst_setOpcode(mcInst, X86_XACQUIRE_PREFIX);
	}
#endif

	insn->numImmediatesTranslated = 0;

	for (index = 0; index < X86_MAX_OPERANDS; ++index) {
		if (insn->operands[index].encoding != ENCODING_NONE) {
			if (translateOperand(mcInst, &insn->operands[index], insn)) {
				return true;
			}
		}
	}

	return false;
}